

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ParseStageMetas(AsciiParser *this)

{
  StreamReader *pSVar1;
  bool bVar2;
  ulong uVar3;
  char c;
  
  bVar2 = Expect(this,'(');
  if ((bVar2) && (bVar2 = SkipCommentAndWhitespaceAndNewline(this,true), bVar2)) {
    while( true ) {
      bVar2 = Eof(this);
      if (bVar2) {
        return true;
      }
      bVar2 = LookChar1(this,&c);
      if (!bVar2) {
        return false;
      }
      if (c == ')') break;
      bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (!bVar2) {
        return false;
      }
      bVar2 = ParseStageMetaOpt(this);
      if (!bVar2) {
        return false;
      }
      bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (!bVar2) {
        return false;
      }
    }
    pSVar1 = this->_sr;
    uVar3 = pSVar1->idx_ + 1;
    if (uVar3 <= pSVar1->length_) {
      pSVar1->idx_ = uVar3;
      bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseStageMetas() {
  if (!Expect('(')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!LookChar1(&c)) {
      return false;
    }

    if (c == ')') {
      if (!SeekTo(CurrLoc() + 1)) {
        return false;
      }

      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      DCOUT("Stage metas end");

      // end
      return true;

    } else {
      if (!SkipCommentAndWhitespaceAndNewline()) {
        // eof
        return false;
      }

      if (!ParseStageMetaOpt()) {
        // parse error
        return false;
      }
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }
  }

  DCOUT("ParseStageMetas end");
  return true;
}